

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chimp_scan.hpp
# Opt level: O3

void __thiscall
duckdb::ChimpScanState<float>::ChimpScanState(ChimpScanState<float> *this,ColumnSegment *segment)

{
  data_ptr_t pdVar1;
  idx_t iVar2;
  BufferManager *pBVar3;
  uint *puVar4;
  BufferHandle BStack_38;
  
  (this->super_SegmentScanState)._vptr_SegmentScanState =
       (_func_int **)&PTR__ChimpScanState_024673c0;
  BufferHandle::BufferHandle(&this->handle);
  this->total_value_count = 0;
  (this->group_state).chimp_state.input.input = (uint8_t *)0x0;
  (this->group_state).chimp_state.input.index = 0;
  switchD_012e3010::default(&(this->group_state).chimp_state.reference_value,0,0x1040c);
  (this->group_state).chimp_state.first = true;
  (this->group_state).chimp_state.leading_zeros = 0xff;
  (this->group_state).chimp_state.trailing_zeros = '\0';
  this->segment = segment;
  this->segment_count =
       (segment->super_SegmentBase<duckdb::ColumnSegment>).count.super___atomic_base<unsigned_long>.
       _M_i;
  pBVar3 = BufferManager::GetBufferManager(segment->db);
  (*pBVar3->_vptr_BufferManager[7])(&BStack_38,pBVar3,&segment->block);
  BufferHandle::operator=(&this->handle,&BStack_38);
  BufferHandle::~BufferHandle(&BStack_38);
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&(this->handle).node);
  pdVar1 = ((this->handle).node.ptr)->buffer;
  iVar2 = segment->offset;
  puVar4 = (uint *)(pdVar1 + iVar2);
  (this->group_state).chimp_state.input.input = (uint8_t *)(puVar4 + 1);
  (this->group_state).chimp_state.input.index = 0;
  (this->group_state).chimp_state.leading_zeros = 0xff;
  (this->group_state).chimp_state.trailing_zeros = '\0';
  (this->group_state).chimp_state.reference_value = 0;
  (this->group_state).chimp_state.ring_buffer.index = 0;
  (this->group_state).chimp_state.first = true;
  (this->group_state).index = 0;
  this->metadata_ptr = pdVar1 + *puVar4 + iVar2;
  return;
}

Assistant:

explicit ChimpScanState(ColumnSegment &segment) : segment(segment), segment_count(segment.count) {
		auto &buffer_manager = BufferManager::GetBufferManager(segment.db);

		handle = buffer_manager.Pin(segment.block);
		auto dataptr = handle.Ptr();
		// ScanStates never exceed the boundaries of a Segment,
		// but are not guaranteed to start at the beginning of the Block
		auto start_of_data_segment = dataptr + segment.GetBlockOffset() + ChimpPrimitives::HEADER_SIZE;
		group_state.Init(start_of_data_segment);
		auto metadata_offset = Load<uint32_t>(dataptr + segment.GetBlockOffset());
		metadata_ptr = dataptr + segment.GetBlockOffset() + metadata_offset;
	}